

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

string * __thiscall
SceneW::writeXml_abi_cxx11_(string *__return_storage_ptr__,SceneW *this,int indent)

{
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  pointer ppWVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  stringstream str;
  char *local_238;
  long local_230;
  char local_228 [16];
  string local_218;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_238,local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<Scene",6);
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"title","");
  pcVar1 = (this->title)._M_dataplus._M_p;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar1,pcVar1 + (this->title)._M_string_length);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_1d8,(Util *)local_1b8,(stringstream *)local_1f8,&local_218,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0]);
  }
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,">",1);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  ppWVar4 = (this->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppWVar4) {
    uVar5 = 0;
    do {
      (**ppWVar4[uVar5]->_vptr_Widget)(&local_238,ppWVar4[uVar5],(ulong)(indent + 1));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_238,local_230);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_238 != local_228) {
        operator_delete(local_238);
      }
      uVar5 = uVar5 + 1;
      ppWVar4 = (this->super_Widget).children.
                super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->super_Widget).children.
                                   super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppWVar4 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"</Scene>",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string SceneW::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Scene";

	Util::writeXmlAttribute(str, "title", title);
	writeXmlAttributes(str);

	str << ">" << std::endl;

	for (int i = 0; i < children.size(); i++)
	{
		str << children[i]->writeXml(indent + 1) << std::endl;
	}

	str << "</Scene>";
	return str.str();
}